

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void glfw_key_callback(GLFWwindow *window,int key,int scancode,int action,int mods)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  char *pcVar4;
  double dVar5;
  int local_94 [3];
  value_type local_88;
  int local_78 [3];
  value_type local_6c;
  int local_5c [3];
  value_type local_50;
  int local_40 [3];
  value_type local_34;
  int local_24;
  int local_20;
  int c;
  int mods_local;
  int action_local;
  int scancode_local;
  int key_local;
  GLFWwindow *window_local;
  
  if (action == 1) {
    local_20 = mods;
    c = action;
    mods_local = scancode;
    action_local = key;
    _scancode_local = window;
    if (key == 0x100) {
      glfwSetWindowShouldClose(window,1);
    }
    else if (key == 0x57) {
      wireframe = (bool)((wireframe ^ 0xffU) & 1);
      uVar3 = 0x1b02;
      if (wireframe != false) {
        uVar3 = 0x1b01;
      }
      glPolygonMode(0x408,uVar3);
    }
    else if ((key < 0x31) || (0x39 < key)) {
      if (key == 0x30) {
        *variable = 0.0;
        poVar2 = std::operator<<((ostream *)&std::cout,var_name);
        poVar2 = std::operator<<(poVar2," = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*variable);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        regenerateBuffer();
      }
      else if (key == 0x109) {
        *variable = *variable + 0.1;
        poVar2 = std::operator<<((ostream *)&std::cout,var_name);
        poVar2 = std::operator<<(poVar2," = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*variable);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        regenerateBuffer();
      }
      else if (key == 0x108) {
        *variable = *variable - 0.1;
        poVar2 = std::operator<<((ostream *)&std::cout,var_name);
        poVar2 = std::operator<<(poVar2," = ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,*variable);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        regenerateBuffer();
      }
      else if (key == 0x50) {
        c = 1;
        action_local = 0x50;
        for (local_24 = 0; local_24 < 9; local_24 = local_24 + 1) {
          poVar2 = std::operator<<((ostream *)&std::cout,legendre_param_names[local_24]);
          poVar2 = std::operator<<(poVar2," = ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,legendre_params[local_24]);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
      }
      else if (key == 0x54) {
        textured = (bool)((textured ^ 0xffU) & 1);
        poVar2 = std::operator<<((ostream *)&std::cout,"Textured = ");
        pcVar4 = "false";
        if ((textured & 1U) != 0) {
          pcVar4 = "true";
        }
        poVar2 = std::operator<<(poVar2,pcVar4);
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else if ((key == 0x14e) || (key == 0x3d)) {
        if ((mods & 1U) == 0) {
          theta_n = theta_n + 2;
          phi_n = phi_n + 1;
        }
        else {
          theta_n = theta_n + 0x14;
          phi_n = phi_n + 10;
        }
        regenerateIndices();
        regenerateSpherePositions();
        regenerateSHBuffer();
        regenerateBuffer();
      }
      else if ((key == 0x14d) || (key == 0x2d)) {
        if ((mods & 1U) == 0) {
          theta_n = theta_n - 2;
          phi_n = phi_n - 1;
        }
        else {
          theta_n = theta_n - 0x14;
          phi_n = phi_n - 10;
        }
        if (theta_n < 0x20) {
          theta_n = 0x20;
        }
        if (phi_n < 0x10) {
          phi_n = 0x10;
        }
        regenerateIndices();
        regenerateSpherePositions();
        regenerateSHBuffer();
        regenerateBuffer();
      }
      else if ((key == 0x148) || (key == 0x49)) {
        dVar5 = (double)glfwGetTime();
        local_34.startTime = (float)dVar5;
        local_40[2] = 1;
        local_40[1] = 0;
        local_40[0] = 0;
        glm::detail::tvec3<float>::tvec3<int,int,int>
                  (&local_34.axis,local_40 + 2,local_40 + 1,local_40);
        std::vector<Rotation,_std::allocator<Rotation>_>::push_back(&rotations,&local_34);
      }
      else if ((key == 0x144) || (key == 0x4a)) {
        dVar5 = (double)glfwGetTime();
        local_50.startTime = (float)dVar5;
        local_5c[2] = 0;
        local_5c[1] = 1;
        local_5c[0] = 0;
        glm::detail::tvec3<float>::tvec3<int,int,int>
                  (&local_50.axis,local_5c + 2,local_5c + 1,local_5c);
        std::vector<Rotation,_std::allocator<Rotation>_>::push_back(&rotations,&local_50);
      }
      else if ((key == 0x142) || (key == 0x4d)) {
        dVar5 = (double)glfwGetTime();
        local_6c.startTime = (float)dVar5;
        local_78[2] = 0xffffffff;
        local_78[1] = 0;
        local_78[0] = 0;
        glm::detail::tvec3<float>::tvec3<int,int,int>
                  (&local_6c.axis,local_78 + 2,local_78 + 1,local_78);
        std::vector<Rotation,_std::allocator<Rotation>_>::push_back(&rotations,&local_6c);
      }
      else if ((key == 0x146) || (key == 0x4c)) {
        dVar5 = (double)glfwGetTime();
        local_88.startTime = (float)dVar5;
        local_94[2] = 0;
        local_94[1] = 0xffffffff;
        local_94[0] = 0;
        glm::detail::tvec3<float>::tvec3<int,int,int>
                  (&local_88.axis,local_94 + 2,local_94 + 1,local_94);
        std::vector<Rotation,_std::allocator<Rotation>_>::push_back(&rotations,&local_88);
      }
      else if ((key == 0x145) || (key == 0x4b)) {
        std::vector<Rotation,_std::allocator<Rotation>_>::clear(&rotations);
        rotationFrames = 0;
        antiRotationFrames = 0;
      }
      else {
        iVar1 = (int)theta_n;
        if (key == 0x45) {
          rotationFrames = rotationFrames + iVar1;
        }
        else if (key == 0x52) {
          rotationFrames = rotationFrames + iVar1;
          antiRotationFrames = antiRotationFrames + iVar1;
        }
      }
    }
    else {
      legendre_index = (size_t)(key + -0x31);
      variable = legendre_params + legendre_index;
      var_name = legendre_param_names[legendre_index];
      poVar2 = std::operator<<((ostream *)&std::cout,var_name);
      poVar2 = std::operator<<(poVar2," = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*variable);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

static void glfw_key_callback(GLFWwindow* window, int key, int scancode, int action, int mods) {
    if (action != GLFW_PRESS) return;

    if (key == GLFW_KEY_ESCAPE) {
        glfwSetWindowShouldClose(window, true);
    } else if (key == GLFW_KEY_W) {
        wireframe = !wireframe;
        glPolygonMode(GL_FRONT_AND_BACK, wireframe ? GL_LINE : GL_FILL);
    } else if (key >= GLFW_KEY_1 && key <= GLFW_KEY_9) {
        legendre_index = size_t(key - GLFW_KEY_1);
        variable = &legendre_params[legendre_index];
        var_name = legendre_param_names[legendre_index];
        cout << var_name << " = " << *variable << endl;
    } else if (key == GLFW_KEY_0) {
        *variable = 0;
        cout << var_name << " = " << *variable << endl;
        regenerateBuffer();
    } else if (key == GLFW_KEY_UP) {
        *variable += 0.1;
        cout << var_name << " = " << *variable << endl;
        regenerateBuffer();
    } else if (key == GLFW_KEY_DOWN) {
        *variable -= 0.1;
        cout << var_name << " = " << *variable << endl;
        regenerateBuffer();
    } else if (key == GLFW_KEY_P) {
        for (int c = 0; c < 9; c++) {
            cout << legendre_param_names[c] << " = " << legendre_params[c] << endl;
        }
    }

    else if (key == GLFW_KEY_T) {
        textured = !textured;
        cout << "Textured = " << (textured ? "true" : "false") << endl;
    }

    else if (key == GLFW_KEY_KP_ADD || key == GLFW_KEY_EQUAL) {
        if (mods & GLFW_MOD_SHIFT) {
            theta_n += 20;
            phi_n += 10;
        } else {
            theta_n += 2;
            phi_n += 1;
        }
        regenerateIndices();
        regenerateSpherePositions();
        regenerateSHBuffer();
        regenerateBuffer();
    }
    else if (key == GLFW_KEY_KP_SUBTRACT || key == GLFW_KEY_MINUS) {
        if (mods & GLFW_MOD_SHIFT) {
            theta_n -= 20;
            phi_n -= 10;
        } else {
            theta_n -= 2;
            phi_n -= 1;
        }
        if (theta_n < MIN_THETA_N) theta_n = MIN_THETA_N;
        if (phi_n < MIN_PHI_N) phi_n = MIN_PHI_N;
        regenerateIndices();
        regenerateSpherePositions();
        regenerateSHBuffer();
        regenerateBuffer();
    }

    else if (key == GLFW_KEY_KP_8 || key == GLFW_KEY_I) {
        rotations.push_back({float(glfwGetTime()), vec3(1, 0, 0)});
    } else if (key == GLFW_KEY_KP_4 || key == GLFW_KEY_J) {
        rotations.push_back({float(glfwGetTime()), vec3(0, 1, 0)});
    } else if (key == GLFW_KEY_KP_2 || key == GLFW_KEY_M) {
        rotations.push_back({float(glfwGetTime()), vec3(-1, 0, 0)});
    } else if (key == GLFW_KEY_KP_6 || key == GLFW_KEY_L) {
        rotations.push_back({float(glfwGetTime()), vec3(0, -1, 0)});
    } else if (key == GLFW_KEY_KP_5 || key == GLFW_KEY_K) {
        rotations.clear();
        rotationFrames = 0;
        antiRotationFrames = 0;
    }

    else if (key == GLFW_KEY_E) {
        rotationFrames += theta_n;
    } else if (key == GLFW_KEY_R) {
        rotationFrames += theta_n;
        antiRotationFrames += theta_n;
    }
}